

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O1

int lddmc_sat_one(MDD mdd,uint32_t *values,size_t count)

{
  uint8_t *puVar1;
  size_t sVar2;
  
  sVar2 = 0;
  while( true ) {
    if (mdd == 0) {
      return 0;
    }
    if (mdd == 1) break;
    if (count == sVar2) {
      __assert_fail("count != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0x89c,"int lddmc_sat_one(MDD, uint32_t *, size_t)");
    }
    puVar1 = nodes->data;
    values[sVar2] = *(uint32_t *)(puVar1 + mdd * 0x10 + 6);
    mdd = *(ulong *)(puVar1 + mdd * 0x10 + 8) >> 0x11;
    sVar2 = sVar2 + 1;
  }
  return 1;
}

Assistant:

int
lddmc_sat_one(MDD mdd, uint32_t* values, size_t count)
{
    if (mdd == lddmc_false) return 0;
    if (mdd == lddmc_true) return 1;
    assert(count != 0);
    mddnode_t n = LDD_GETNODE(mdd);
    *values = mddnode_getvalue(n);
    return lddmc_sat_one(mddnode_getdown(n), values+1, count-1);
}